

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

void translateBrowsePathToNodeIds
               (UA_Server *server,UA_Session *session,UA_BrowsePath *path,
               UA_BrowsePathResult *result)

{
  UA_Boolean UVar1;
  UA_StatusCode UVar2;
  void *pvVar3;
  ulong local_80;
  size_t i_1;
  UA_NodeId *next;
  size_t nextCount;
  size_t nextSize;
  UA_NodeId *current;
  size_t currentCount;
  size_t currentSize;
  size_t targetsSize;
  size_t i;
  UA_BrowsePathResult *result_local;
  UA_BrowsePath *path_local;
  UA_Session *session_local;
  UA_Server *server_local;
  
  if ((path->relativePath).elementsSize == 0) {
    result->statusCode = 0x800f0000;
  }
  else {
    i = (size_t)result;
    result_local = (UA_BrowsePathResult *)path;
    path_local = (UA_BrowsePath *)session;
    session_local = (UA_Session *)server;
    for (targetsSize = 0; targetsSize < *(ulong *)(result_local + 1); targetsSize = targetsSize + 1)
    {
      UVar1 = UA_QualifiedName_isNull
                        ((UA_QualifiedName *)
                         (result_local[1].targetsSize + targetsSize * 0x38 + 0x20));
      if (UVar1) {
        *(undefined4 *)i = 0x80600000;
        return;
      }
    }
    currentSize = 10;
    pvVar3 = malloc(0x230);
    *(void **)(i + 0x10) = pvVar3;
    if (*(long *)(i + 0x10) == 0) {
      *(undefined4 *)i = 0x80030000;
    }
    else {
      currentCount = 10;
      current = (UA_NodeId *)0x0;
      nextSize = (size_t)malloc(0xf0);
      if ((void *)nextSize == (void *)0x0) {
        *(undefined4 *)i = 0x80030000;
        free(*(void **)(i + 0x10));
      }
      else {
        nextCount = 10;
        next = (UA_NodeId *)0x0;
        i_1 = (size_t)malloc(0xf0);
        if ((void *)i_1 == (void *)0x0) {
          *(undefined4 *)i = 0x80030000;
          free(*(void **)(i + 0x10));
          free((void *)nextSize);
        }
        else {
          UVar2 = UA_NodeId_copy((UA_NodeId *)result_local,(UA_NodeId *)nextSize);
          *(UA_StatusCode *)i = UVar2;
          if (*(int *)i == 0) {
            current = (UA_NodeId *)0x1;
            walkBrowsePath((UA_Server *)session_local,(UA_Session *)path_local,
                           (UA_BrowsePath *)result_local,(UA_BrowsePathResult *)i,currentSize,
                           (UA_NodeId **)&nextSize,&currentCount,(size_t *)&current,
                           (UA_NodeId **)&i_1,&nextCount,(size_t *)&next);
            if (current != (UA_NodeId *)0x0) {
              __assert_fail("currentCount == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jh-isw[P]OpcUaConsoleClient/open62541/open62541.c"
                            ,0x5b51,
                            "void translateBrowsePathToNodeIds(UA_Server *, UA_Session *, const UA_BrowsePath *, UA_BrowsePathResult *)"
                           );
            }
            if (next != (UA_NodeId *)0x0) {
              __assert_fail("nextCount == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jh-isw[P]OpcUaConsoleClient/open62541/open62541.c"
                            ,0x5b52,
                            "void translateBrowsePathToNodeIds(UA_Server *, UA_Session *, const UA_BrowsePath *, UA_BrowsePathResult *)"
                           );
            }
            if ((*(long *)(i + 8) == 0) && (*(int *)i == 0)) {
              *(undefined4 *)i = 0x806f0000;
            }
            free((void *)nextSize);
            free((void *)i_1);
            if (*(int *)i != 0) {
              for (local_80 = 0; local_80 < *(ulong *)(i + 8); local_80 = local_80 + 1) {
                UA_BrowsePathTarget_deleteMembers
                          ((UA_BrowsePathTarget *)(*(long *)(i + 0x10) + local_80 * 0x38));
              }
              free(*(void **)(i + 0x10));
              *(undefined8 *)(i + 0x10) = 0;
              *(undefined8 *)(i + 8) = 0;
            }
          }
          else {
            free(*(void **)(i + 0x10));
            free((void *)nextSize);
            free((void *)i_1);
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void
translateBrowsePathToNodeIds(UA_Server *server, UA_Session *session,
                             const UA_BrowsePath *path, UA_BrowsePathResult *result) {
    if(path->relativePath.elementsSize <= 0) {
        result->statusCode = UA_STATUSCODE_BADNOTHINGTODO;
        return;
    }
        
    /* RelativePath elements must not have an empty targetName */
    for(size_t i = 0; i < path->relativePath.elementsSize; ++i) {
        if(UA_QualifiedName_isNull(&path->relativePath.elements[i].targetName)) {
            result->statusCode = UA_STATUSCODE_BADBROWSENAMEINVALID;
            return;
        }
    }

    /* Allocate memory for the targets */
    size_t targetsSize = 10; /* When to realloc; the member count is stored in
                              * result->targetsSize */
    result->targets = (UA_BrowsePathTarget*)UA_malloc(sizeof(UA_BrowsePathTarget) * targetsSize);
    if(!result->targets) {
        result->statusCode = UA_STATUSCODE_BADOUTOFMEMORY;
        return;
    }

    /* Allocate memory for two temporary arrays. One with the results for the
     * previous depth of the path. The other for the new results at the current
     * depth. The two arrays alternate as we descend down the tree. */
    size_t currentSize = 10; /* When to realloc */
    size_t currentCount = 0; /* Current elements */
    UA_NodeId *current = (UA_NodeId*)UA_malloc(sizeof(UA_NodeId) * currentSize);
    if(!current) {
        result->statusCode = UA_STATUSCODE_BADOUTOFMEMORY;
        UA_free(result->targets);
        return;
    }
    size_t nextSize = 10; /* When to realloc */
    size_t nextCount = 0; /* Current elements */
    UA_NodeId *next = (UA_NodeId*)UA_malloc(sizeof(UA_NodeId) * nextSize);
    if(!next) {
        result->statusCode = UA_STATUSCODE_BADOUTOFMEMORY;
        UA_free(result->targets);
        UA_free(current);
        return;
    }

    /* Copy the starting node into current */
    result->statusCode = UA_NodeId_copy(&path->startingNode, &current[0]);
    if(result->statusCode != UA_STATUSCODE_GOOD) {
        UA_free(result->targets);
        UA_free(current);
        UA_free(next);
        return;
    }
    currentCount = 1;

    /* Walk the path elements */
    walkBrowsePath(server, session, path, result, targetsSize,
                   &current, &currentSize, &currentCount,
                   &next, &nextSize, &nextCount);

    UA_assert(currentCount == 0);
    UA_assert(nextCount == 0);

    /* No results => BadNoMatch status code */
    if(result->targetsSize == 0 && result->statusCode == UA_STATUSCODE_GOOD)
        result->statusCode = UA_STATUSCODE_BADNOMATCH;

    /* Clean up the temporary arrays and the targets */
    UA_free(current);
    UA_free(next);
    if(result->statusCode != UA_STATUSCODE_GOOD) {
        for(size_t i = 0; i < result->targetsSize; ++i)
            UA_BrowsePathTarget_deleteMembers(&result->targets[i]);
        UA_free(result->targets);
        result->targets = NULL;
        result->targetsSize = 0;
    }
}